

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O0

void Am_Update(Am_Object *window)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Ptr input;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Draw_Method draw_method;
  Am_Window_ToDo *win_todo;
  undefined1 local_20 [8];
  Am_Value value;
  Am_Object *window_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)window;
  Am_Value::Am_Value((Am_Value *)local_20);
  pAVar2 = Am_Object::Peek(window,0x7d6,0);
  Am_Value::operator=((Am_Value *)local_20,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_20);
  if (bVar1) {
    input = Am_Value::operator_cast_to_void_((Am_Value *)local_20);
    draw_method.Call = (Am_Draw_Method_Type *)Am_Window_ToDo::Narrow(input);
    if (((Am_Window_ToDo *)draw_method.Call)->flags != 0) {
      Am_Window_ToDo::Remove((Am_Window_ToDo *)draw_method.Call);
      Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)local_48);
      pAVar2 = Am_Object::Get(window,2000,0);
      Am_Draw_Method::operator=((Am_Draw_Method *)local_48,pAVar2);
      Am_Object::Am_Object(&local_50,window);
      (*(code *)draw_method.from_wrapper)(&local_50,0,0);
      Am_Object::~Am_Object(&local_50);
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

void
Am_Update(Am_Object window)
{
  Am_Value value;
  value = window.Peek(Am_TODO);
  if (value.Valid()) {
    Am_Window_ToDo *win_todo = Am_Window_ToDo::Narrow(value);
    if (win_todo->flags) {
      win_todo->Remove();
      Am_Draw_Method draw_method;
      draw_method = window.Get(Am_DRAW_METHOD);
      //ignores drawonable and offset parameters
      draw_method.Call(window, nullptr, 0, 0);
    }
  }
}